

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

ebml_element *
EBML_ElementSkipData
          (ebml_element *p,stream *Input,ebml_parser_context *Context,ebml_element *TestReadElt,
          bool_t AllowDummyElt)

{
  code *pcVar1;
  void *pvVar2;
  ebml_element *Element;
  filepos_t fVar3;
  int bUpperElement;
  int local_2c;
  
  pvVar2 = Node_GetData((node *)p,0x100,1);
  if (pvVar2 == (void *)0x0) {
    if (TestReadElt != (ebml_element *)0x0) {
      __assert_fail("TestReadElt == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x61,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    if (p->SizePosition <= p->ElementPosition) {
      __assert_fail("p->ElementPosition < p->SizePosition",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x62,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,99,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    Element = (ebml_element *)0x0;
    (**(code **)((long)(Input->Base).VMT + 0x78))(Input,p->EndPosition,0);
  }
  else {
    local_2c = 0;
    Element = EBML_FindNextElement(Input,Context,&local_2c,AllowDummyElt);
    if (Element != (ebml_element *)0x0) {
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                      ,0x69,
                      "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                     );
      }
      pcVar1 = *(code **)((long)(Input->Base).VMT + 0x78);
      fVar3 = EBML_ElementPositionData(Element);
      (*pcVar1)(Input,fVar3,0);
    }
  }
  return Element;
}

Assistant:

ebml_element *EBML_ElementSkipData(ebml_element *p, struct stream *Input, const ebml_parser_context *Context, ebml_element *TestReadElt, bool_t AllowDummyElt)
{
    ebml_element *Result = NULL;
    if (EBML_ElementIsFiniteSize(p)) {
        assert(TestReadElt == NULL);
        assert(p->ElementPosition < p->SizePosition);
        Stream_Seek(Input, EBML_ElementPositionEnd(p), SEEK_SET);
    } else {
        // read elements until an upper element is found
        int bUpperElement = 0; // trick to call FindNextID correctly
        Result = EBML_FindNextElement(Input, Context, &bUpperElement, AllowDummyElt);
        if (Result != NULL)
            Stream_Seek(Input, EBML_ElementPositionData(Result), SEEK_SET);
    }
    return Result;
}